

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O2

void lj_dispatch_update(global_State *g)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  int iVar6;
  GCRef GVar7;
  GCRef GVar8;
  GCRef GVar9;
  long lVar10;
  uint uVar11;
  code *pcVar12;
  uint uVar13;
  code *pcVar14;
  code *pcVar15;
  ushort *puVar16;
  ushort *puVar17;
  uint uVar18;
  uint uVar19;
  
  uVar5 = (uint)g[1].gc.freed;
  iVar6 = *(int *)((long)&g[1].gc.tabnum + 4);
  uVar13 = (uVar5 & 1) << 4;
  uVar19 = 0x25;
  if (iVar6 == 0) {
    uVar19 = 0;
  }
  bVar1 = g->hookmask;
  uVar11 = 0x44;
  if (-1 < (char)bVar1) {
    uVar11 = (uint)((bVar1 & 0xc) != 0) << 2;
  }
  bVar2 = g->dispatchmode;
  uVar11 = uVar11 | uVar19 | uVar13;
  uVar18 = bVar1 & 3 | uVar11;
  if (uVar18 == bVar2) {
    return;
  }
  g->dispatchmode = (uint8_t)uVar18;
  if ((uVar19 & 0x30 | uVar13) == 0x10) {
    pcVar12 = lj_BC_FORL;
    pcVar14 = lj_BC_ITERL;
    pcVar15 = lj_BC_LOOP;
    puVar16 = lj_bc_ofs + 0x5c;
    puVar17 = lj_bc_ofs + 0x59;
  }
  else {
    pcVar12 = *(code **)(g[8].gcroot + 0x18);
    pcVar14 = *(code **)(g[8].gcroot + 0x1e);
    pcVar15 = *(code **)(g[8].gcroot + 0x24);
    puVar16 = lj_bc_ofs + 0x5d;
    puVar17 = lj_bc_ofs + 0x5a;
  }
  uVar3 = *puVar16;
  uVar4 = *puVar17;
  *(code **)(g[8].gcroot + 0x16) = pcVar12;
  *(code **)(g[8].gcroot + 0x1c) = pcVar14;
  *(code **)(g[8].gcroot + 0x22) = pcVar15;
  uVar19 = uVar18 ^ bVar2;
  if ((uVar19 & 100) == 0) {
    if ((uVar11 & 4) == 0) {
      *(code **)(g[6].gcroot + 6) = pcVar12;
      *(code **)(g[6].gcroot + 0xc) = pcVar14;
      *(code **)(g[6].gcroot + 0x12) = pcVar15;
      if ((bVar1 & 2) != 0) goto LAB_00111fa7;
      GVar7.gcptr32 = g[8].gcroot[0xb].gcptr32;
      GVar8.gcptr32 = g[8].gcroot[0xc].gcptr32;
      GVar9.gcptr32 = g[8].gcroot[0xd].gcptr32;
      g[6].bc_cfunc_int = g[8].gcroot[10].gcptr32;
      g[6].bc_cfunc_ext = GVar7.gcptr32;
      g[6].cur_L = (GCRef)GVar8.gcptr32;
      g[6].mem_L = (GCRef)GVar9.gcptr32;
      GVar7.gcptr32 = g[8].gcroot[0xf].gcptr32;
      g[6].jit_base = (MRef)g[8].gcroot[0xe].gcptr32;
      g[6].ctype_state = (MRef)GVar7.gcptr32;
      pcVar12 = *(code **)(g[8].gcroot + 0x10);
LAB_00111fc3:
      *(code **)g[6].gcroot = pcVar12;
    }
  }
  else if ((uVar11 & 4) == 0) {
    memcpy(&g[5].bc_cfunc_int,g[7].gcroot + 10,0x2c8);
    if ((bVar1 & 2) != 0) {
LAB_00111fa7:
      pcVar12 = lj_vm_rethook;
      *(code **)&g[6].bc_cfunc_int = lj_vm_rethook;
      *(code **)&g[6].cur_L = lj_vm_rethook;
      *(code **)&g[6].jit_base = lj_vm_rethook;
      goto LAB_00111fc3;
    }
  }
  else {
    pcVar12 = lj_vm_record;
    if (iVar6 == 0) {
      pcVar12 = lj_vm_inshook;
    }
    pcVar14 = lj_vm_profhook;
    if (-1 < (char)bVar1) {
      pcVar14 = pcVar12;
    }
    for (lVar10 = 0; lVar10 != 0x59; lVar10 = lVar10 + 1) {
      *(code **)(&g[5].bc_cfunc_int + lVar10 * 2) = pcVar14;
    }
  }
  if ((uVar19 & 1) == 0) {
    if ((uVar18 & 1) != 0) goto LAB_00111fea;
  }
  else {
    lVar10 = 0;
    if ((uVar18 & 1) != 0) {
      for (; lVar10 != 0x41; lVar10 = lVar10 + 1) {
        *(code **)(g[6].gcroot + lVar10 * 2 + 0x1a) = lj_vm_callhook;
      }
      goto LAB_00111fea;
    }
    for (; lVar10 != 0x41; lVar10 = lVar10 + 1) {
      *(code **)(g[6].gcroot + lVar10 * 2 + 0x1a) = lj_BC_ISLT + lj_bc_ofs[lVar10 + 0x59];
    }
  }
  *(code **)(g[6].gcroot + 0x1a) = lj_BC_ISLT + uVar4;
  *(code **)(g[6].gcroot + 0x20) = lj_BC_ISLT + uVar3;
LAB_00111fea:
  if ((char)((bVar2 & 0x10) >> 4) != '\0' || (uVar5 & 1) == 0) {
    return;
  }
  lj_dispatch_init_hotcount(g);
  return;
}

Assistant:

void lj_dispatch_update(global_State *g)
{
  uint8_t oldmode = g->dispatchmode;
  uint8_t mode = 0;
#if LJ_HASJIT
  mode |= (G2J(g)->flags & JIT_F_ON) ? DISPMODE_JIT : 0;
  mode |= G2J(g)->state != LJ_TRACE_IDLE ?
	    (DISPMODE_REC|DISPMODE_INS|DISPMODE_CALL) : 0;
#endif
#if LJ_HASPROFILE
  mode |= (g->hookmask & HOOK_PROFILE) ? (DISPMODE_PROF|DISPMODE_INS) : 0;
#endif
  mode |= (g->hookmask & (LUA_MASKLINE|LUA_MASKCOUNT)) ? DISPMODE_INS : 0;
  mode |= (g->hookmask & LUA_MASKCALL) ? DISPMODE_CALL : 0;
  mode |= (g->hookmask & LUA_MASKRET) ? DISPMODE_RET : 0;
  if (oldmode != mode) {  /* Mode changed? */
    ASMFunction *disp = G2GG(g)->dispatch;
    ASMFunction f_forl, f_iterl, f_loop, f_funcf, f_funcv;
    g->dispatchmode = mode;

    /* Hotcount if JIT is on, but not while recording. */
    if ((mode & (DISPMODE_JIT|DISPMODE_REC)) == DISPMODE_JIT) {
      f_forl = makeasmfunc(lj_bc_ofs[BC_FORL]);
      f_iterl = makeasmfunc(lj_bc_ofs[BC_ITERL]);
      f_loop = makeasmfunc(lj_bc_ofs[BC_LOOP]);
      f_funcf = makeasmfunc(lj_bc_ofs[BC_FUNCF]);
      f_funcv = makeasmfunc(lj_bc_ofs[BC_FUNCV]);
    } else {  /* Otherwise use the non-hotcounting instructions. */
      f_forl = disp[GG_LEN_DDISP+BC_IFORL];
      f_iterl = disp[GG_LEN_DDISP+BC_IITERL];
      f_loop = disp[GG_LEN_DDISP+BC_ILOOP];
      f_funcf = makeasmfunc(lj_bc_ofs[BC_IFUNCF]);
      f_funcv = makeasmfunc(lj_bc_ofs[BC_IFUNCV]);
    }
    /* Init static counting instruction dispatch first (may be copied below). */
    disp[GG_LEN_DDISP+BC_FORL] = f_forl;
    disp[GG_LEN_DDISP+BC_ITERL] = f_iterl;
    disp[GG_LEN_DDISP+BC_LOOP] = f_loop;

    /* Set dynamic instruction dispatch. */
    if ((oldmode ^ mode) & (DISPMODE_PROF|DISPMODE_REC|DISPMODE_INS)) {
      /* Need to update the whole table. */
      if (!(mode & DISPMODE_INS)) {  /* No ins dispatch? */
	/* Copy static dispatch table to dynamic dispatch table. */
	memcpy(&disp[0], &disp[GG_LEN_DDISP], GG_LEN_SDISP*sizeof(ASMFunction));
	/* Overwrite with dynamic return dispatch. */
	if ((mode & DISPMODE_RET)) {
	  disp[BC_RETM] = lj_vm_rethook;
	  disp[BC_RET] = lj_vm_rethook;
	  disp[BC_RET0] = lj_vm_rethook;
	  disp[BC_RET1] = lj_vm_rethook;
	}
      } else {
	/* The recording dispatch also checks for hooks. */
	ASMFunction f = (mode & DISPMODE_PROF) ? lj_vm_profhook :
			(mode & DISPMODE_REC) ? lj_vm_record : lj_vm_inshook;
	uint32_t i;
	for (i = 0; i < GG_LEN_SDISP; i++)
	  disp[i] = f;
      }
    } else if (!(mode & DISPMODE_INS)) {
      /* Otherwise set dynamic counting ins. */
      disp[BC_FORL] = f_forl;
      disp[BC_ITERL] = f_iterl;
      disp[BC_LOOP] = f_loop;
      /* Set dynamic return dispatch. */
      if ((mode & DISPMODE_RET)) {
	disp[BC_RETM] = lj_vm_rethook;
	disp[BC_RET] = lj_vm_rethook;
	disp[BC_RET0] = lj_vm_rethook;
	disp[BC_RET1] = lj_vm_rethook;
      } else {
	disp[BC_RETM] = disp[GG_LEN_DDISP+BC_RETM];
	disp[BC_RET] = disp[GG_LEN_DDISP+BC_RET];
	disp[BC_RET0] = disp[GG_LEN_DDISP+BC_RET0];
	disp[BC_RET1] = disp[GG_LEN_DDISP+BC_RET1];
      }
    }

    /* Set dynamic call dispatch. */
    if ((oldmode ^ mode) & DISPMODE_CALL) {  /* Update the whole table? */
      uint32_t i;
      if ((mode & DISPMODE_CALL) == 0) {  /* No call hooks? */
	for (i = GG_LEN_SDISP; i < GG_LEN_DDISP; i++)
	  disp[i] = makeasmfunc(lj_bc_ofs[i]);
      } else {
	for (i = GG_LEN_SDISP; i < GG_LEN_DDISP; i++)
	  disp[i] = lj_vm_callhook;
      }
    }
    if (!(mode & DISPMODE_CALL)) {  /* Overwrite dynamic counting ins. */
      disp[BC_FUNCF] = f_funcf;
      disp[BC_FUNCV] = f_funcv;
    }

#if LJ_HASJIT
    /* Reset hotcounts for JIT off to on transition. */
    if ((mode & DISPMODE_JIT) && !(oldmode & DISPMODE_JIT))
      lj_dispatch_init_hotcount(g);
#endif
  }
}